

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_seed.c
# Opt level: O0

void NthElement(long N,long *StartSeed)

{
  long *in_RSI;
  long in_RDI;
  int i;
  long Mult;
  long Z;
  long local_20;
  long local_18;
  long local_8;
  
  if ((0 < verbose) && (NthElement::ln = NthElement::ln + 1, NthElement::ln % 1000 == 0)) {
    fprintf(_stderr,"%c\b",(ulong)(uint)(int)lnoise[NthElement::ln % 4]);
  }
  local_20 = Multiplier;
  local_18 = *in_RSI;
  for (local_8 = in_RDI; 0 < local_8; local_8 = local_8 / 2) {
    if (local_8 % 2 != 0) {
      local_18 = (local_20 * local_18) % Modulus;
    }
    local_20 = (local_20 * local_20) % Modulus;
  }
  *in_RSI = local_18;
  return;
}

Assistant:

void NthElement (DSS_HUGE N, DSS_HUGE *StartSeed)
   {
   DSS_HUGE Z;
   DSS_HUGE Mult;
   static int ln=-1;
   int i;

   if ((verbose > 0) && ++ln % 1000 == 0)
       {
       i = ln % LN_CNT;
       fprintf(stderr, "%c\b", lnoise[i]);
       }
   Mult = Multiplier;
   Z = (DSS_HUGE) *StartSeed;
   while (N > 0 )
      {
      if (N % 2 != 0)    /* testing for oddness, this seems portable */
         Z = (Mult * Z) % Modulus;
      N = N / 2;         /* integer division, truncates */
      Mult = (Mult * Mult) % Modulus;
      }
   *StartSeed = Z;

   return;
   }